

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.c
# Opt level: O3

CURLcode Curl_md4it(uchar *output,uchar *input,size_t len)

{
  uchar *__dest;
  MD4_u32plus MVar1;
  uchar uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  MD4_CTX local_c0;
  
  local_c0.a = 0x67452301;
  local_c0.b = 0xefcdab89;
  local_c0.c = 0x98badcfe;
  local_c0.d = 0x10325476;
  uVar3 = curlx_uztoui(len);
  local_c0.lo = uVar3 & 0x1fffffff;
  local_c0.hi = uVar3 >> 0x1d;
  if (0x3f < uVar3) {
    input = (uchar *)body(&local_c0,input,(ulong)(uVar3 & 0xffffffc0));
    uVar3 = uVar3 & 0x3f;
  }
  MVar1 = local_c0.lo;
  __dest = local_c0.buffer;
  memcpy(__dest,input,(ulong)uVar3);
  uVar5 = (ulong)(MVar1 & 0x3f);
  lVar4 = uVar5 + 1;
  local_c0.buffer[uVar5] = 0x80;
  uVar5 = uVar5 ^ 0x3f;
  if (uVar5 < 8) {
    memset(__dest + lVar4,0,uVar5);
    uVar5 = 0x40;
    body(&local_c0,__dest,0x40);
    lVar4 = 0;
  }
  memset(__dest + lVar4,0,uVar5 - 8);
  local_c0.lo = local_c0.lo << 3;
  local_c0.buffer[0x38] = curlx_ultouc((ulong)(local_c0.lo & 0xff));
  local_c0.buffer[0x39] = curlx_ultouc((ulong)local_c0.lo._1_1_);
  local_c0.buffer[0x3a] = curlx_ultouc((ulong)local_c0.lo._2_1_);
  local_c0.buffer[0x3b] = curlx_ultouc((ulong)local_c0.lo._3_1_);
  local_c0.buffer[0x3c] = curlx_ultouc((ulong)(byte)local_c0.hi);
  local_c0.buffer[0x3d] = curlx_ultouc((ulong)local_c0.hi._1_1_);
  local_c0.buffer[0x3e] = curlx_ultouc((ulong)local_c0.hi._2_1_);
  local_c0.buffer[0x3f] = curlx_ultouc((ulong)local_c0.hi._3_1_);
  body(&local_c0,__dest,0x40);
  uVar2 = curlx_ultouc(local_c0._8_8_ & 0xff);
  *output = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._8_8_ >> 8 & 0xff);
  output[1] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._8_8_ >> 0x10 & 0xff);
  output[2] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._8_8_ >> 0x18 & 0xff);
  output[3] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._8_8_ >> 0x20 & 0xff);
  output[4] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._8_8_ >> 0x28 & 0xff);
  output[5] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._8_8_ >> 0x30 & 0xff);
  output[6] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._8_8_ >> 0x38);
  output[7] = uVar2;
  uVar2 = curlx_ultouc(local_c0._16_8_ & 0xff);
  output[8] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._16_8_ >> 8 & 0xff);
  output[9] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._16_8_ >> 0x10 & 0xff);
  output[10] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._16_8_ >> 0x18 & 0xff);
  output[0xb] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._16_8_ >> 0x20 & 0xff);
  output[0xc] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._16_8_ >> 0x28 & 0xff);
  output[0xd] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._16_8_ >> 0x30 & 0xff);
  output[0xe] = uVar2;
  uVar2 = curlx_ultouc((ulong)local_c0._16_8_ >> 0x38);
  output[0xf] = uVar2;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_md4it(unsigned char *output, const unsigned char *input,
                    const size_t len)
{
  MD4_CTX ctx;

#ifdef VOID_MD4_INIT
  MD4_Init(&ctx);
#else
  if(!MD4_Init(&ctx))
    return CURLE_FAILED_INIT;
#endif

  MD4_Update(&ctx, input, curlx_uztoui(len));
  MD4_Final(output, &ctx);
  return CURLE_OK;
}